

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction_widgets.cpp
# Opt level: O0

void __thiscall QtWidgetsActionPrivate::setMenu(QtWidgetsActionPrivate *this,QObject *menu)

{
  bool bVar1;
  QAction *a;
  QMenu *this_00;
  QMenuPrivate *in_RSI;
  QtWidgetsActionPrivate *in_RDI;
  QMenu *theMenu;
  QAction *q;
  
  a = q_func(in_RDI);
  this_00 = qobject_cast<QMenu*>((QObject *)0x4b041f);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x4b0434);
  if (bVar1) {
    QPointer<QMenu>::operator->((QPointer<QMenu> *)0x4b044a);
    QMenu::d_func((QMenu *)0x4b0452);
    QMenuPrivate::setOverrideMenuAction(in_RSI,a);
  }
  QPointer<QMenu>::operator=((QPointer<QMenu> *)this_00,(QMenu *)in_RDI);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x4b0483);
  if (bVar1) {
    QPointer<QMenu>::operator->((QPointer<QMenu> *)0x4b0499);
    QMenu::d_func((QMenu *)0x4b04a1);
    QMenuPrivate::setOverrideMenuAction(in_RSI,a);
  }
  QActionPrivate::sendDataChanged();
  return;
}

Assistant:

void QtWidgetsActionPrivate::setMenu(QObject *menu)
{
    Q_Q(QAction);
    QMenu *theMenu = qobject_cast<QMenu*>(menu);
    Q_ASSERT_X(!menu || theMenu, "QAction::setMenu",
               "QAction::setMenu expects a QMenu* in widget applications");
    if (m_menu)
        m_menu->d_func()->setOverrideMenuAction(nullptr); //we reset the default action of any previous menu
    m_menu = theMenu;
    if (m_menu)
        m_menu->d_func()->setOverrideMenuAction(q);
    sendDataChanged();
}